

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase433::run(TestCase433 *this)

{
  bool bVar1;
  Own<int,_MyDisposer> *pOVar2;
  bool local_289;
  int *piStack_288;
  bool _kj_shouldLog_8;
  int **local_280;
  undefined1 local_278 [8];
  DebugComparison<int_*&,_int_*> _kjCondition_8;
  void *pvStack_248;
  bool _kj_shouldLog_7;
  int **local_240;
  undefined1 local_238 [8];
  DebugComparison<int_*&,_std::nullptr_t> _kjCondition_7;
  void *pvStack_208;
  bool _kj_shouldLog_6;
  int **local_200;
  undefined1 local_1f8 [8];
  DebugComparison<int_*&,_std::nullptr_t> _kjCondition_6;
  void *pvStack_1c8;
  bool _kj_shouldLog_5;
  int **local_1c0;
  undefined1 local_1b8 [8];
  DebugComparison<int_*&,_std::nullptr_t> _kjCondition_5;
  Own<int,_MyDisposer> ptr_2;
  Own<int,_MyDisposer> ptr2_1;
  int *piStack_178;
  bool _kj_shouldLog_4;
  int **local_170;
  undefined1 local_168 [8];
  DebugComparison<int_*&,_int_*> _kjCondition_4;
  void *pvStack_138;
  bool _kj_shouldLog_3;
  int **local_130;
  undefined1 local_128 [8];
  DebugComparison<int_*&,_std::nullptr_t> _kjCondition_3;
  Own<int,_MyDisposer> ptr2;
  void *pvStack_f0;
  bool _kj_shouldLog_2;
  int **local_e8;
  undefined1 local_e0 [8];
  DebugComparison<int_*&,_std::nullptr_t> _kjCondition_2;
  Own<int,_MyDisposer> ptr_1;
  int *piStack_a8;
  bool _kj_shouldLog_1;
  int **local_a0;
  undefined1 local_98 [8];
  DebugComparison<int_*&,_int_*> _kjCondition_1;
  void *pvStack_68;
  bool _kj_shouldLog;
  int **local_50;
  undefined1 local_48 [8];
  DebugComparison<int_*&,_std::nullptr_t> _kjCondition;
  Own<int,_MyDisposer> ptr;
  int i;
  TestCase433 *this_local;
  
  Own<int,_MyDisposer>::Own
            ((Own<int,_MyDisposer> *)&_kjCondition.result,(int *)((long)&ptr.ptr + 4));
  local_50 = (int **)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&run::disposedPtr);
  pvStack_68 = (void *)0x0;
  kj::_::DebugExpression<int*&>::operator==
            ((DebugComparison<int_*&,_std::nullptr_t> *)local_48,(DebugExpression<int*&> *)&local_50
             ,&stack0xffffffffffffff98);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int*&,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x1be,ERROR,"\"failed: expected \" \"disposedPtr == nullptr\", _kjCondition",
                 (char (*) [40])"failed: expected disposedPtr == nullptr",
                 (DebugComparison<int_*&,_std::nullptr_t> *)local_48);
      _kjCondition_1._39_1_ = 0;
    }
  }
  Own<int,_MyDisposer>::~Own((Own<int,_MyDisposer> *)&_kjCondition.result);
  local_a0 = (int **)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&run::disposedPtr);
  piStack_a8 = (int *)((long)&ptr.ptr + 4);
  kj::_::DebugExpression<int*&>::operator==
            ((DebugComparison<int_*&,_int_*> *)local_98,(DebugExpression<int*&> *)&local_a0,
             &stack0xffffffffffffff58);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
  if (!bVar1) {
    ptr_1.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (ptr_1.ptr._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[35],kj::_::DebugComparison<int*&,int*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x1c0,ERROR,"\"failed: expected \" \"disposedPtr == &i\", _kjCondition",
                 (char (*) [35])"failed: expected disposedPtr == &i",
                 (DebugComparison<int_*&,_int_*> *)local_98);
      ptr_1.ptr._7_1_ = false;
    }
  }
  run::disposedPtr = (int *)0x0;
  Own<int,_MyDisposer>::Own
            ((Own<int,_MyDisposer> *)&_kjCondition_2.result,(int *)((long)&ptr.ptr + 4));
  local_e8 = (int **)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&run::disposedPtr);
  pvStack_f0 = (void *)0x0;
  kj::_::DebugExpression<int*&>::operator==
            ((DebugComparison<int_*&,_std::nullptr_t> *)local_e0,(DebugExpression<int*&> *)&local_e8
             ,&stack0xffffffffffffff10);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
  if (!bVar1) {
    ptr2.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (ptr2.ptr._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int*&,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x1c5,ERROR,"\"failed: expected \" \"disposedPtr == nullptr\", _kjCondition",
                 (char (*) [40])"failed: expected disposedPtr == nullptr",
                 (DebugComparison<int_*&,_std::nullptr_t> *)local_e0);
      ptr2.ptr._7_1_ = false;
    }
  }
  pOVar2 = mv<kj::Own<int,kj::(anonymous_namespace)::TestCase433::run()::MyDisposer>>
                     ((Own<int,_MyDisposer> *)&_kjCondition_2.result);
  Own<int,_MyDisposer>::Own((Own<int,_MyDisposer> *)&_kjCondition_3.result,pOVar2);
  local_130 = (int **)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&run::disposedPtr);
  pvStack_138 = (void *)0x0;
  kj::_::DebugExpression<int*&>::operator==
            ((DebugComparison<int_*&,_std::nullptr_t> *)local_128,
             (DebugExpression<int*&> *)&local_130,&stack0xfffffffffffffec8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_128);
  if (!bVar1) {
    _kjCondition_4._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int*&,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x1c7,ERROR,"\"failed: expected \" \"disposedPtr == nullptr\", _kjCondition",
                 (char (*) [40])"failed: expected disposedPtr == nullptr",
                 (DebugComparison<int_*&,_std::nullptr_t> *)local_128);
      _kjCondition_4._39_1_ = 0;
    }
  }
  Own<int,_MyDisposer>::~Own((Own<int,_MyDisposer> *)&_kjCondition_3.result);
  Own<int,_MyDisposer>::~Own((Own<int,_MyDisposer> *)&_kjCondition_2.result);
  local_170 = (int **)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&run::disposedPtr);
  piStack_178 = (int *)((long)&ptr.ptr + 4);
  kj::_::DebugExpression<int*&>::operator==
            ((DebugComparison<int_*&,_int_*> *)local_168,(DebugExpression<int*&> *)&local_170,
             &stack0xfffffffffffffe88);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_168);
  if (!bVar1) {
    ptr2_1.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (ptr2_1.ptr._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[35],kj::_::DebugComparison<int*&,int*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x1c9,ERROR,"\"failed: expected \" \"disposedPtr == &i\", _kjCondition",
                 (char (*) [35])"failed: expected disposedPtr == &i",
                 (DebugComparison<int_*&,_int_*> *)local_168);
      ptr2_1.ptr._7_1_ = false;
    }
  }
  run::disposedPtr = (int *)0x0;
  Own<int,_MyDisposer>::Own(&ptr_2);
  Own<int,_MyDisposer>::Own
            ((Own<int,_MyDisposer> *)&_kjCondition_5.result,(int *)((long)&ptr.ptr + 4));
  local_1c0 = (int **)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&run::disposedPtr);
  pvStack_1c8 = (void *)0x0;
  kj::_::DebugExpression<int*&>::operator==
            ((DebugComparison<int_*&,_std::nullptr_t> *)local_1b8,
             (DebugExpression<int*&> *)&local_1c0,&stack0xfffffffffffffe38);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b8);
  if (!bVar1) {
    _kjCondition_6._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int*&,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x1d0,ERROR,"\"failed: expected \" \"disposedPtr == nullptr\", _kjCondition",
                 (char (*) [40])"failed: expected disposedPtr == nullptr",
                 (DebugComparison<int_*&,_std::nullptr_t> *)local_1b8);
      _kjCondition_6._39_1_ = 0;
    }
  }
  pOVar2 = mv<kj::Own<int,kj::(anonymous_namespace)::TestCase433::run()::MyDisposer>>
                     ((Own<int,_MyDisposer> *)&_kjCondition_5.result);
  Own<int,_MyDisposer>::operator=(&ptr_2,pOVar2);
  local_200 = (int **)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&run::disposedPtr);
  pvStack_208 = (void *)0x0;
  kj::_::DebugExpression<int*&>::operator==
            ((DebugComparison<int_*&,_std::nullptr_t> *)local_1f8,
             (DebugExpression<int*&> *)&local_200,&stack0xfffffffffffffdf8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f8);
  if (!bVar1) {
    _kjCondition_7._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_7._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int*&,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x1d2,ERROR,"\"failed: expected \" \"disposedPtr == nullptr\", _kjCondition",
                 (char (*) [40])"failed: expected disposedPtr == nullptr",
                 (DebugComparison<int_*&,_std::nullptr_t> *)local_1f8);
      _kjCondition_7._39_1_ = 0;
    }
  }
  Own<int,_MyDisposer>::~Own((Own<int,_MyDisposer> *)&_kjCondition_5.result);
  local_240 = (int **)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&run::disposedPtr);
  pvStack_248 = (void *)0x0;
  kj::_::DebugExpression<int*&>::operator==
            ((DebugComparison<int_*&,_std::nullptr_t> *)local_238,
             (DebugExpression<int*&> *)&local_240,&stack0xfffffffffffffdb8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_238);
  if (!bVar1) {
    _kjCondition_8._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_8._39_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugComparison<int*&,decltype(nullptr)>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x1d4,ERROR,"\"failed: expected \" \"disposedPtr == nullptr\", _kjCondition",
                 (char (*) [40])"failed: expected disposedPtr == nullptr",
                 (DebugComparison<int_*&,_std::nullptr_t> *)local_238);
      _kjCondition_8._39_1_ = 0;
    }
  }
  Own<int,_MyDisposer>::~Own(&ptr_2);
  local_280 = (int **)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&run::disposedPtr);
  piStack_288 = (int *)((long)&ptr.ptr + 4);
  kj::_::DebugExpression<int*&>::operator==
            ((DebugComparison<int_*&,_int_*> *)local_278,(DebugExpression<int*&> *)&local_280,
             &stack0xfffffffffffffd78);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_278);
  if (!bVar1) {
    local_289 = kj::_::Debug::shouldLog(ERROR);
    while (local_289 != false) {
      kj::_::Debug::log<char_const(&)[35],kj::_::DebugComparison<int*&,int*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/memory-test.c++"
                 ,0x1d6,ERROR,"\"failed: expected \" \"disposedPtr == &i\", _kjCondition",
                 (char (*) [35])"failed: expected disposedPtr == &i",
                 (DebugComparison<int_*&,_int_*> *)local_278);
      local_289 = false;
    }
  }
  return;
}

Assistant:

static void dispose(int* value) {
      KJ_EXPECT(disposedPtr == nullptr);
      disposedPtr = value;
    }